

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxquality.hpp
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::qualConstraintViolation
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *maxviol,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *sumviol)

{
  uint uVar1;
  type_conflict5 tVar2;
  int iVar3;
  int iVar4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  int __c;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  viol;
  int col;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *rowvec;
  int row;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  solu;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  undefined4 in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb7c;
  undefined7 in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb87;
  undefined1 *in_stack_fffffffffffffb88;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffb90;
  undefined7 in_stack_fffffffffffffb98;
  undefined1 in_stack_fffffffffffffb9f;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffba0;
  undefined1 local_400 [48];
  double in_stack_fffffffffffffc30;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffc38;
  undefined1 local_3b0 [80];
  undefined1 local_360 [80];
  undefined1 local_310 [80];
  undefined8 local_2c0;
  undefined1 local_2b4 [80];
  undefined1 local_264 [80];
  uint local_214;
  undefined8 local_210;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_208;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1b8;
  int local_1b0;
  undefined1 local_1a0 [24];
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_160;
  undefined8 *local_158;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  undefined8 local_148;
  undefined8 *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  undefined8 local_108;
  undefined8 *local_100;
  undefined8 *local_f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_e9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  undefined1 *local_b8;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 *local_a0;
  undefined8 *local_98;
  undefined8 *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  cpp_dec_float<100U,_int,_void> *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  cpp_dec_float<100U,_int,_void> *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined1 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_180 = 0;
  local_98 = &local_180;
  local_178 = in_RDX;
  local_170 = in_RSI;
  local_88 = local_98;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
  local_188 = 0;
  local_a8 = local_178;
  local_b0 = &local_188;
  local_a0 = local_b0;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x4d3f00);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_fffffffffffffb90,(int)((ulong)in_stack_fffffffffffffb88 >> 0x20));
  (**(code **)(*in_RDI + 0x300))(in_RDI,local_1a0);
  for (local_1b0 = 0; iVar4 = local_1b0,
      iVar3 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x4d3f52), iVar4 < iVar3; local_1b0 = local_1b0 + 1) {
    local_1b8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::rowVector((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                            in_stack_fffffffffffffb7c);
    local_210 = 0;
    local_150 = &local_208;
    local_158 = &local_210;
    local_160 = 0;
    local_f8 = local_158;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffffb90,(double)in_stack_fffffffffffffb88,
               (type *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
    for (local_214 = 0; uVar1 = local_214,
        iVar4 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size(local_1b8), (int)uVar1 < iVar4; local_214 = local_214 + 1) {
      pnVar5 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::value(local_1b8,local_214);
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::index(local_1b8,(char *)(ulong)local_214,__c);
      local_e8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                              in_stack_fffffffffffffb7c);
      local_e0 = pnVar5;
      local_d8 = local_264;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_e9,pnVar5,local_e8);
      local_d0 = local_264;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
      local_c0 = local_e0;
      local_c8 = local_e8;
      local_b8 = local_264;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                 (cpp_dec_float<100U,_int,_void> *)0x4d410e);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
      ::operator+=(in_stack_fffffffffffffba0,
                   (self_type *)CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
    }
    local_2c0 = 0;
    local_138 = local_2b4;
    local_140 = &local_2c0;
    local_148 = 0;
    local_100 = local_140;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffffb90,(double)in_stack_fffffffffffffb88,
               (type *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::lhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),in_stack_fffffffffffffb7c
         );
    tVar2 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x4d41fa);
    if (tVar2) {
      local_38 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::lhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                       in_stack_fffffffffffffb7c);
      local_30 = &local_208;
      local_28 = local_360;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_39,local_30,local_38);
      local_20 = local_360;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
      local_10 = local_30;
      local_18 = local_38;
      local_8 = local_360;
      boost::multiprecision::default_ops::
      eval_subtract<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                 (cpp_dec_float<100U,_int,_void> *)0x4d42d8);
      spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      local_118 = local_2b4;
      local_120 = local_310;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    }
    else {
      in_stack_fffffffffffffba0 =
           SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::rhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                 in_stack_fffffffffffffb7c);
      in_stack_fffffffffffffb9f =
           boost::multiprecision::operator>
                     ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                      (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)0x4d4357);
      if ((bool)in_stack_fffffffffffffb9f) {
        in_stack_fffffffffffffb90 =
             &SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::rhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                    in_stack_fffffffffffffb7c)->m_backend;
        in_stack_fffffffffffffb88 = local_400;
        local_70 = &local_208;
        local_78 = in_stack_fffffffffffffb90;
        local_68 = in_stack_fffffffffffffb88;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_79,local_70,
                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)in_stack_fffffffffffffb90);
        local_60 = in_stack_fffffffffffffb88;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
        local_50 = local_70;
        local_58 = local_78;
        local_48 = in_stack_fffffffffffffb88;
        boost::multiprecision::default_ops::
        eval_subtract<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                   (cpp_dec_float<100U,_int,_void> *)0x4d4435);
        spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
        local_128 = local_2b4;
        local_130 = local_3b0;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      }
    }
    in_stack_fffffffffffffb87 =
         boost::multiprecision::operator>
                   ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                    (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)0x4d449c);
    if ((bool)in_stack_fffffffffffffb87) {
      local_108 = local_170;
      local_110 = local_2b4;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    }
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
    ::operator+=(in_stack_fffffffffffffba0,
                 (self_type *)CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x4d451d);
  return;
}

Assistant:

void SPxSolverBase<R>::qualConstraintViolation(R& maxviol, R& sumviol) const
{
   maxviol = 0.0;
   sumviol = 0.0;

   VectorBase<R> solu(this->nCols());

   getPrimalSol(solu);

   for(int row = 0; row < this->nRows(); ++row)
   {
      const SVectorBase<R>& rowvec = this->rowVector(row);

      R val = 0.0;

      for(int col = 0; col < rowvec.size(); ++col)
         val += rowvec.value(col) * solu[rowvec.index(col)];

      R viol = 0.0;

      assert(this->lhs(row) <= this->rhs(row) + 1e-9);

      if(val < this->lhs(row))
         viol = spxAbs(val - this->lhs(row));
      else if(val > this->rhs(row))
         viol = spxAbs(val - this->rhs(row));

      if(viol > maxviol)
         maxviol = viol;

      sumviol += viol;
   }
}